

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O1

int bit_encode_write(bit_encode_t *be,uchar *bits,int nbits)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = (uint)be->bbits + nbits;
  iVar3 = iVar2;
  if (iVar2 < 8) {
    be->buf = be->buf | (*bits >> (8U - (char)nbits & 0x1f)) << (8U - (char)iVar2 & 0x1f);
  }
  else {
    do {
      fputc((uint)(byte)(*bits >> (be->bbits & 0x1f) | be->buf),(FILE *)be->fh);
      be->buf = *bits << (8 - be->bbits & 0x1f);
      iVar2 = iVar3 + -8;
      bits = bits + 1;
      bVar1 = 0xf < iVar3;
      iVar3 = iVar2;
    } while (bVar1);
  }
  be->bbits = (uchar)iVar2;
  return nbits;
}

Assistant:

int
bit_encode_write(bit_encode_t *be, unsigned char const *bits, int nbits)
{
    int tbits;

    tbits = nbits + be->bbits;
    if (tbits < 8)  {
        /* Append to buffer. */
        be->buf |= ((bits[0] >> (8 - nbits)) << (8 - tbits));
    }
    else {
        int i = 0;
        while (tbits >= 8) {
            /* Shift bits out of the buffer and splice with high-order bits */
            fputc(be->buf | ((bits[i]) >> be->bbits), be->fh);
            /* Put low-order bits back into buffer */
            be->buf = (bits[i] << (8 - be->bbits)) & 0xff;
            tbits -= 8;
            ++i;
        }
    }
    /* tbits contains remaining number of  bits. */
    be->bbits = tbits;

    return nbits;
}